

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::fail(UtestShell *this,char *text,char *fileName,size_t lineNumber,
                TestTerminator *testTerminator)

{
  TestTerminator *lineNumber_00;
  size_t fileName_00;
  TestResult *pTVar1;
  SimpleString local_a8;
  FailFailure local_98;
  TestTerminator *local_30;
  TestTerminator *testTerminator_local;
  size_t lineNumber_local;
  char *fileName_local;
  char *text_local;
  UtestShell *this_local;
  
  local_30 = testTerminator;
  testTerminator_local = (TestTerminator *)lineNumber;
  lineNumber_local = (size_t)fileName;
  fileName_local = text;
  text_local = (char *)this;
  pTVar1 = getTestResult(this);
  (*pTVar1->_vptr_TestResult[10])();
  fileName_00 = lineNumber_local;
  lineNumber_00 = testTerminator_local;
  SimpleString::SimpleString(&local_a8,fileName_local);
  FailFailure::FailFailure(&local_98,this,(char *)fileName_00,(size_t)lineNumber_00,&local_a8);
  (*this->_vptr_UtestShell[0x27])(this,&local_98,local_30);
  FailFailure::~FailFailure(&local_98);
  SimpleString::~SimpleString(&local_a8);
  return;
}

Assistant:

void UtestShell::fail(const char *text, const char* fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    failWith(FailFailure(this, fileName, lineNumber, text), testTerminator);
}